

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O2

int * Cba_VecLoadFanins(Cba_Ntk_t *p,Vec_Int_t *vOut,int iFon,int *pFanins,int nFanins,int nTotal,
                       int fSigned)

{
  ulong uVar1;
  int Entry;
  int iVar2;
  ulong uVar3;
  
  if (nTotal < nFanins) {
    __assert_fail("nFanins <= nTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                  ,0x79,
                  "int *Cba_VecLoadFanins(Cba_Ntk_t *, Vec_Int_t *, int, int *, int, int, int)");
  }
  if (iFon < 1) {
    if (iFon < 0) {
      Cba_BlastConst(p,vOut,iFon,nTotal,fSigned);
    }
    else {
      Vec_IntFill(vOut,nTotal,0);
    }
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    if (fSigned != 0) {
      iVar2 = pFanins[(long)nFanins + -1];
    }
    vOut->nSize = 0;
    uVar1 = 0;
    if (0 < nTotal) {
      uVar1 = (ulong)(uint)nTotal;
    }
    for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      Entry = iVar2;
      if ((long)uVar3 < (long)nFanins) {
        Entry = pFanins[uVar3];
      }
      Vec_IntPush(vOut,Entry);
    }
  }
  if (vOut->nSize == nTotal) {
    return vOut->pArray;
  }
  __assert_fail("Vec_IntSize(vOut) == nTotal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                ,0x86,"int *Cba_VecLoadFanins(Cba_Ntk_t *, Vec_Int_t *, int, int *, int, int, int)")
  ;
}

Assistant:

int * Cba_VecLoadFanins( Cba_Ntk_t * p, Vec_Int_t * vOut, int iFon, int * pFanins, int nFanins, int nTotal, int fSigned )
{
    assert( nFanins <= nTotal );
    if ( Cba_FonIsReal(iFon) )
    {
        int i, Fill = fSigned ? pFanins[nFanins-1] : 0;
        Vec_IntClear( vOut );
        for( i = 0; i < nTotal; i++) 
            Vec_IntPush( vOut, i < nFanins ? pFanins[i] : Fill );
    }
    else if ( Cba_FonIsConst(iFon) )
        Cba_BlastConst( p, vOut, iFon, nTotal, fSigned );
    else if ( iFon == 0 ) // undriven input
        Vec_IntFill( vOut, nTotal, 0 );
    else assert( 0 );
    assert( Vec_IntSize(vOut) == nTotal );
    return Vec_IntArray( vOut );
}